

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O2

void __thiscall UdpSocket::Implementation::Bind(Implementation *this,IpEndpointName *localEndpoint)

{
  int iVar1;
  runtime_error *this_00;
  sockaddr_in bindSockAddr;
  
  SockaddrFromIpEndpointName(&bindSockAddr,localEndpoint);
  iVar1 = bind(this->socket_,(sockaddr *)&bindSockAddr,0x10);
  if (-1 < iVar1) {
    this->isBound_ = true;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"unable to bind udp socket\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Bind( const IpEndpointName& localEndpoint )
	{
		struct sockaddr_in bindSockAddr;
		SockaddrFromIpEndpointName( bindSockAddr, localEndpoint );

        if (bind(socket_, (struct sockaddr *)&bindSockAddr, sizeof(bindSockAddr)) < 0) {
            throw std::runtime_error("unable to bind udp socket\n");
        }

		isBound_ = true;
	}